

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  from_chars_result_t<char> fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint8_t digit;
  byte bVar17;
  int iVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  byte *pbVar23;
  long lVar24;
  undefined8 uVar25;
  byte *pbVar26;
  size_t sVar27;
  uint uVar28;
  uint uVar29;
  byte *pbVar30;
  ulong uVar31;
  ulong uVar32;
  byte *pbVar33;
  char *pcVar34;
  byte *pbVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  from_chars_result_t<char> fVar41;
  adjusted_mantissa aVar42;
  from_chars_result_t<char> fVar43;
  parsed_number_string_t<char> pns;
  byte local_80;
  parsed_number_string_t<char> answer;
  
  if (first == last) {
    uVar25 = 0x16;
    goto LAB_0012ab6e;
  }
  answer.fraction.ptr = (char *)0x0;
  answer.fraction.length = 0;
  answer.exponent = 0;
  answer.mantissa._0_3_ = 0;
  answer.mantissa._3_5_ = 0;
  answer.lastmatch._0_3_ = 0;
  answer.lastmatch._3_5_ = 0;
  answer.valid = false;
  answer.too_many_digits = false;
  bVar20 = *first;
  answer.negative = bVar20 == 0x2d;
  local_80 = options.decimal_point;
  pbVar23 = (byte *)first;
  bVar17 = bVar20;
  if (!answer.negative) goto LAB_0012a2b7;
  pbVar23 = (byte *)(first + 1);
  if (pbVar23 == (byte *)last) {
LAB_0012a55e:
    if (((ulong)options & 0x10) == 0) {
      fVar41 = detail::parse_infnan<double,char>(first,last,value);
    }
    else {
      fVar41._8_8_ = 0x16;
      fVar41.ptr = first;
    }
  }
  else {
    bVar17 = *pbVar23;
    if (((ulong)options & 0x20) != 0) {
      if ((byte)(bVar17 - 0x30) < 10) goto LAB_0012a2b7;
      goto LAB_0012a55e;
    }
    if (bVar17 != local_80 && 9 < (byte)(bVar17 - 0x30)) goto LAB_0012a55e;
LAB_0012a2b7:
    uVar32 = 0;
    for (pbVar26 = pbVar23;
        (pbVar30 = (byte *)last, pbVar26 != (byte *)last &&
        (pbVar30 = pbVar26, (byte)(*pbVar26 - 0x30) < 10)); pbVar26 = pbVar26 + 1) {
      uVar32 = (uVar32 * 10 + (ulong)*pbVar26) - 0x30;
    }
    answer.integer.length = (long)pbVar30 - (long)pbVar23;
    answer.integer.ptr = (char *)pbVar23;
    if ((((ulong)options & 0x20) != 0) &&
       ((answer.integer.length == 0 || (1 < (long)answer.integer.length && bVar17 == 0x30))))
    goto LAB_0012a55e;
    if ((pbVar26 == (byte *)last) || (*pbVar30 != local_80)) {
      bVar17 = 0;
      pbVar33 = (byte *)0x0;
      sVar27 = answer.integer.length;
      pbVar26 = pbVar30;
    }
    else {
      answer.fraction.ptr = (char *)(pbVar30 + 1);
      pcVar34 = last + ~(ulong)pbVar30;
      pbVar33 = (byte *)answer.fraction.ptr;
      while ((7 < (long)pcVar34 &&
             (uVar37 = *(long *)pbVar33 + 0xcfcfcfcfcfcfcfd0,
             ((*(long *)pbVar33 + 0x4646464646464646U | uVar37) & 0x8080808080808080) == 0))) {
        uVar37 = (uVar37 >> 8) + uVar37 * 10;
        uVar32 = ((uVar37 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar37 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar32 * 100000000;
        pbVar33 = pbVar33 + 8;
        pcVar34 = pcVar34 + -8;
      }
      for (; (pbVar26 = (byte *)last, pbVar33 != (byte *)last &&
             (pbVar26 = pbVar33, (byte)(*pbVar33 - 0x30) < 10)); pbVar33 = pbVar33 + 1) {
        uVar32 = (ulong)(byte)(*pbVar33 - 0x30) + uVar32 * 10;
      }
      pbVar33 = (byte *)answer.fraction.ptr + -(long)pbVar26;
      answer.fraction.length = (long)pbVar26 - (long)answer.fraction.ptr;
      bVar17 = 1;
      sVar27 = answer.integer.length - (long)pbVar33;
    }
    uVar37 = (ulong)answer.negative;
    if (((ulong)options & 0x20) != 0) {
      if (!(bool)(bVar17 & pbVar33 == (byte *)0x0)) goto LAB_0012a47b;
      goto LAB_0012a55e;
    }
    if (sVar27 == 0) goto LAB_0012a55e;
LAB_0012a47b:
    if (((((ulong)options & 1) == 0) || (pbVar26 == (byte *)last)) ||
       (bVar17 = *pbVar26, (bVar17 | 0x20) != 0x65)) {
      if ((((ulong)options & 0x40) != 0) && (pbVar26 != (byte *)last)) {
        bVar17 = *pbVar26;
        if ((bVar17 - 0x2b < 0x3a) &&
           ((0x200000002000005U >> ((ulong)(bVar17 - 0x2b) & 0x3f) & 1) != 0)) goto LAB_0012a4c6;
      }
      if ((options.format & general) == scientific) goto LAB_0012a55e;
LAB_0012a583:
      lVar24 = 0;
    }
    else {
LAB_0012a4c6:
      pbVar35 = pbVar26;
      if ((bVar17 - 0x44 < 0x22) && ((0x300000003U >> ((ulong)(bVar17 - 0x44) & 0x3f) & 1) != 0)) {
        pbVar35 = pbVar26 + 1;
      }
      if (pbVar35 == (byte *)last) {
LAB_0012a51b:
        bVar39 = false;
      }
      else {
        if (*pbVar35 != 0x2d) {
          pbVar35 = pbVar35 + (*pbVar35 == 0x2b);
          goto LAB_0012a51b;
        }
        pbVar35 = pbVar35 + 1;
        bVar39 = true;
      }
      if ((pbVar35 == (byte *)last) || (9 < (byte)(*pbVar35 - 0x30))) {
        if (((ulong)options & 4) == 0) goto LAB_0012a55e;
        goto LAB_0012a583;
      }
      lVar19 = 0;
      for (; (pbVar26 = (byte *)last, pbVar35 != (byte *)last &&
             (pbVar26 = pbVar35, (byte)(*pbVar35 - 0x30) < 10)); pbVar35 = pbVar35 + 1) {
        if (lVar19 < 0x10000000) {
          lVar19 = (ulong)(byte)(*pbVar35 - 0x30) + lVar19 * 10;
        }
      }
      lVar24 = -lVar19;
      if (!bVar39) {
        lVar24 = lVar19;
      }
      pbVar33 = pbVar33 + lVar24;
    }
    answer.lastmatch._0_3_ = SUB83(pbVar26,0);
    answer.lastmatch._3_5_ = (undefined5)((ulong)pbVar26 >> 0x18);
    answer.valid = true;
    pbVar35 = pbVar23;
    if ((long)sVar27 < 0x14) {
LAB_0012a627:
      bVar39 = false;
    }
    else {
      for (; (pbVar35 != (byte *)last && (bVar17 = *pbVar35, bVar17 == local_80 || bVar17 == 0x30));
          pbVar35 = pbVar35 + 1) {
        sVar27 = sVar27 - (bVar17 == 0x30);
      }
      if ((long)sVar27 < 0x14) goto LAB_0012a627;
      answer.too_many_digits = true;
      uVar32 = 0;
      for (sVar27 = answer.integer.length; (uVar32 < 1000000000000000000 && (sVar27 != 0));
          sVar27 = sVar27 - 1) {
        uVar32 = (uVar32 * 10 + (long)(char)*pbVar23) - 0x30;
        pbVar23 = pbVar23 + 1;
      }
      pbVar33 = (byte *)answer.fraction.ptr;
      sVar27 = answer.fraction.length;
      if (uVar32 < 1000000000000000000) {
        for (; (pbVar23 = pbVar33, pbVar30 = (byte *)answer.fraction.ptr,
               uVar32 < 1000000000000000000 && (sVar27 != 0)); sVar27 = sVar27 - 1) {
          uVar32 = (uVar32 * 10 + (long)(char)*pbVar33) - 0x30;
          pbVar33 = pbVar33 + 1;
        }
      }
      pbVar33 = pbVar30 + (lVar24 - (long)pbVar23);
      bVar39 = true;
    }
    answer.mantissa._0_3_ = (undefined3)uVar32;
    answer.mantissa._3_5_ = (undefined5)(uVar32 >> 0x18);
    if (pbVar33 + -0x17 < (byte *)0xffffffffffffffd3 || bVar39) {
LAB_0012a6f4:
      uVar31 = 0;
      iVar18 = (int)pbVar33;
      if ((long)pbVar33 < -0x156) {
LAB_0012a72a:
        aVar42.mantissa = 0;
      }
      else {
        aVar42.mantissa = 0;
        if (uVar32 != 0) {
          if (0x134 < (long)pbVar33) {
            uVar31 = 0x7ff;
            goto LAB_0012a72a;
          }
          uVar31 = 0x3f;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          aVar42.mantissa = uVar32 << ((byte)(uVar31 ^ 0x3f) & 0x3f);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = aVar42.mantissa;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
          auVar1 = auVar1 * auVar7;
          if ((~auVar1._8_4_ & 0x1ff) == 0) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = aVar42.mantissa;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
            auVar15._8_8_ = 0;
            auVar15._0_8_ = SUB168(auVar2 * auVar8,8);
            auVar1 = auVar1 + auVar15;
          }
          iVar21 = (((iVar18 * 0x3526a >> 0x10) - (int)(uVar31 ^ 0x3f)) - (auVar1._12_4_ >> 0x1f)) +
                   0x43e;
          bVar20 = 9 - (auVar1[0xf] >> 7);
          uVar31 = auVar1._8_8_ >> (bVar20 & 0x3f);
          if (iVar21 < 1) {
            uVar29 = 1 - iVar21;
            if (uVar29 < 0x40) {
              aVar42.mantissa =
                   (uVar31 >> ((byte)uVar29 & 0x3f)) +
                   (ulong)((uVar31 >> ((ulong)uVar29 & 0x3f) & 1) != 0);
              uVar31 = (ulong)(aVar42.mantissa >> 0x35 != 0);
              aVar42.mantissa = aVar42.mantissa >> 1;
            }
            else {
              uVar31 = 0;
              aVar42.mantissa = 0;
            }
          }
          else {
            aVar42.mantissa = uVar31 & 0xfffffffffffffe;
            if (uVar31 << (bVar20 & 0x3f) != auVar1._8_8_ || ((uint)uVar31 & 3) != 1) {
              aVar42.mantissa = uVar31;
            }
            if (1 < auVar1._0_8_) {
              aVar42.mantissa = uVar31;
            }
            if ((byte *)0x1b < pbVar33 + 4) {
              aVar42.mantissa = uVar31;
            }
            uVar31 = (ulong)((uint)aVar42.mantissa & 1);
            bVar38 = uVar31 + aVar42.mantissa >> 0x36 != 0;
            aVar42.mantissa =
                 (aVar42.mantissa >> 1) + (uVar31 & aVar42.mantissa) & 0x7fefffffffffffff;
            if (bVar38) {
              aVar42.mantissa = 0;
            }
            uVar28 = iVar21 + (uint)bVar38;
            uVar29 = uVar28;
            if (0x7fe < uVar28) {
              uVar29 = 0x7ff;
            }
            uVar31 = (ulong)uVar29;
            if (0x7fe < uVar28) {
              aVar42.mantissa = 0;
            }
          }
        }
      }
      if (bVar39) {
        uVar36 = uVar32 + 1;
        uVar29 = 0;
        if ((long)pbVar33 < -0x156) {
LAB_0012a91e:
          uVar22 = 0;
        }
        else {
          uVar22 = 0;
          uVar29 = 0;
          if (uVar36 != 0) {
            if (0x134 < (long)pbVar33) {
              uVar29 = 0x7ff;
              goto LAB_0012a91e;
            }
            uVar22 = 0x3f;
            if (uVar36 != 0) {
              for (; uVar36 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            uVar36 = uVar36 << ((byte)(uVar22 ^ 0x3f) & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar36;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
            auVar3 = auVar3 * auVar9;
            if ((~auVar3._8_4_ & 0x1ff) == 0) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar36;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
              auVar16._8_8_ = 0;
              auVar16._0_8_ = SUB168(auVar4 * auVar10,8);
              auVar3 = auVar3 + auVar16;
            }
            iVar21 = (((iVar18 * 0x3526a >> 0x10) - (int)(uVar22 ^ 0x3f)) - (auVar3._12_4_ >> 0x1f))
                     + 0x43e;
            bVar20 = 9 - (auVar3[0xf] >> 7);
            uVar36 = auVar3._8_8_ >> (bVar20 & 0x3f);
            if (iVar21 < 1) {
              uVar29 = 1 - iVar21;
              if (0x3f < uVar29) {
                uVar29 = 0;
                goto LAB_0012a91e;
              }
              uVar36 = (uVar36 >> ((byte)uVar29 & 0x3f)) +
                       (ulong)((uVar36 >> ((ulong)uVar29 & 0x3f) & 1) != 0);
              uVar22 = uVar36 >> 1;
              uVar29 = (uint)(uVar36 >> 0x35 != 0);
            }
            else {
              uVar22 = uVar36 & 0xfffffffffffffe;
              if (uVar36 << (bVar20 & 0x3f) != auVar3._8_8_ || ((uint)uVar36 & 3) != 1) {
                uVar22 = uVar36;
              }
              if (1 < auVar3._0_8_) {
                uVar22 = uVar36;
              }
              if ((byte *)0x1b < pbVar33 + 4) {
                uVar22 = uVar36;
              }
              uVar36 = (ulong)((uint)uVar22 & 1);
              bVar39 = uVar36 + uVar22 >> 0x36 != 0;
              uVar22 = (uVar22 >> 1) + (uVar36 & uVar22) & 0x7fefffffffffffff;
              if (bVar39) {
                uVar22 = 0;
              }
              uVar29 = iVar21 + (uint)bVar39;
              if (0x7fe < uVar29) {
                uVar22 = 0;
                uVar29 = 0x7ff;
              }
            }
          }
        }
        if ((aVar42.mantissa != uVar22) || ((uint)uVar31 != uVar29)) {
          uVar31 = 0x3f;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          aVar42.mantissa = uVar32 << ((byte)(uVar31 ^ 0x3f) & 0x3f);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = aVar42.mantissa;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
          auVar5 = auVar5 * auVar11;
          lVar24 = auVar5._8_8_;
          if ((~auVar5._8_4_ & 0x1ff) == 0) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = aVar42.mantissa;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
            lVar24 = lVar24 + (ulong)CARRY8(SUB168(auVar6 * auVar12,8),auVar5._0_8_);
          }
          aVar42.mantissa = lVar24 << ((byte)((ulong)lVar24 >> 0x3f) ^ 1);
          iVar21 = iVar18 * 0x3526a >> 0x10;
          iVar18 = -(int)(uVar31 ^ 0x3f) - (int)(lVar24 >> 0x3f);
          uVar29 = (iVar18 + iVar21) - 0x7bcd;
          uVar31 = (ulong)uVar29;
          if (iVar18 + iVar21 < 0x7bcd) {
            aVar42.power2 = uVar29;
            aVar42._12_4_ = 0;
            answer.exponent = (int64_t)pbVar33;
            aVar42 = digit_comp<double,char>(&answer,aVar42);
            uVar31 = (ulong)(uint)aVar42.power2;
            uVar37 = (ulong)answer.negative;
            uVar32 = CONCAT53(answer.mantissa._3_5_,(undefined3)answer.mantissa);
          }
        }
      }
      uVar29 = 0;
      if ((int)uVar31 == 0x7ff) {
        uVar29 = 0x22;
      }
      uVar36 = 0x22;
      if ((int)uVar31 != 0) {
        uVar36 = (ulong)uVar29;
      }
      if (aVar42.mantissa != 0) {
        uVar36 = (ulong)uVar29;
      }
      *value = (double)(uVar37 << 0x3f | uVar31 << 0x34 | aVar42.mantissa);
      fVar41._8_8_ = uVar36;
      fVar41.ptr = (char *)pbVar26;
      if (uVar32 == 0) {
        fVar41.ec = uVar29;
        fVar41._12_4_ = 0;
      }
    }
    else if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
            (NAN(detail::rounds_to_nearest()::fmin + 1.0) ||
             NAN(1.0 - detail::rounds_to_nearest()::fmin))) {
      if (((long)pbVar33 < 0) ||
         (binary_format_lookup_tables<double,_void>::max_mantissa[(long)pbVar33] < uVar32))
      goto LAB_0012a6f4;
      if (uVar32 != 0) {
        auVar40._8_4_ = (int)(uVar32 >> 0x20);
        auVar40._0_8_ = uVar32;
        auVar40._12_4_ = 0x45300000;
        dVar13 = ((auVar40._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar32) - 4503599627370496.0)) *
                 binary_format_lookup_tables<double,_void>::powers_of_ten[(long)pbVar33];
        goto LAB_0012a864;
      }
      if (bVar20 == 0x2d) {
        uVar29 = 0x80000000;
      }
      else {
        uVar29 = 0;
      }
      *value = (double)((ulong)uVar29 << 0x20);
      fVar41._8_8_ = 0;
      fVar41.ptr = (char *)pbVar26;
    }
    else {
      if (0x20000000000000 < uVar32) goto LAB_0012a6f4;
      dVar13 = (double)(long)uVar32;
      *value = dVar13;
      if ((long)pbVar33 < 0) {
        dVar13 = dVar13 / binary_format_lookup_tables<double,_void>::powers_of_ten[-(long)pbVar33];
      }
      else {
        dVar13 = dVar13 * binary_format_lookup_tables<double,_void>::powers_of_ten[(long)pbVar33];
      }
LAB_0012a864:
      fVar14._8_8_ = 0;
      fVar14.ptr = (char *)pbVar26;
      fVar41._8_8_ = 0;
      fVar41.ptr = (char *)pbVar26;
      *value = dVar13;
      if (bVar20 == 0x2d) {
        *value = -dVar13;
        fVar41 = fVar14;
      }
    }
  }
  uVar25 = fVar41._8_8_;
  first = fVar41.ptr;
LAB_0012ab6e:
  fVar43._8_8_ = uVar25;
  fVar43.ptr = first;
  return fVar43;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (is_supported_float_type<T>(), "only some floating-point types are supported");
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    if (options.format & chars_format::no_infnan) {
      answer.ec = std::errc::invalid_argument;
      answer.ptr = first;
      return answer;
    } else {
      return detail::parse_infnan(first, last, value);
    }
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__) || defined(FASTFLOAT_32BIT)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? T(-0.) : T(0.);
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}